

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QRectF * __thiscall
BorderPaginator::clipRect(QRectF *__return_storage_ptr__,BorderPaginator *this,int page)

{
  qreal qVar1;
  qreal qVar2;
  double dVar3;
  double dVar4;
  QRect QVar5;
  
  QVar5 = QRectF::toRect(&this->rect);
  qVar1 = (qreal)QVar5.y1.m_i.m_i;
  qVar2 = (qreal)(((QVar5._8_8_ >> 0x20) - (QVar5._0_8_ >> 0x20)) + 1);
  if (this->topPage != this->bottomPage) {
    dVar3 = ((double)page * this->pageHeight + this->topMarginAfterPageBreak) - this->border;
    if (dVar3 <= qVar1) {
      dVar3 = qVar1;
    }
    dVar3 = dVar3 - qVar1;
    qVar1 = qVar1 + dVar3;
    dVar3 = (qVar2 - dVar3) + qVar1;
    dVar4 = (double)(page + 1) * this->pageHeight - this->bottomMargin;
    if (dVar4 <= dVar3) {
      dVar3 = dVar4;
    }
    qVar2 = dVar3 - qVar1;
    if (qVar1 + qVar2 <= qVar1) {
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->xp = (double)QVar5.x1.m_i.m_i;
  __return_storage_ptr__->yp = qVar1;
  __return_storage_ptr__->w = (double)(((long)QVar5.x2.m_i.m_i - (long)QVar5.x1.m_i.m_i) + 1);
  __return_storage_ptr__->h = qVar2;
  return __return_storage_ptr__;
}

Assistant:

QRectF clipRect(int page) const
    {
        QRectF clipped = rect.toRect();

        if (topPage != bottomPage) {
            clipped.setTop(qMax(clipped.top(), page * pageHeight + topMarginAfterPageBreak - border));
            clipped.setBottom(qMin(clipped.bottom(), (page + 1) * pageHeight - bottomMargin));

            if (clipped.bottom() <= clipped.top())
                return QRectF();
        }

        return clipped;
    }